

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int pk_parse_key_pkcs8_encrypted_der
              (mbedtls_pk_context *pk,uchar *key,size_t keylen,uchar *pwd,size_t pwdlen)

{
  int iVar1;
  uchar *end_00;
  bool bVar2;
  mbedtls_md_type_t local_98;
  mbedtls_cipher_type_t local_94;
  mbedtls_md_type_t md_alg;
  mbedtls_cipher_type_t cipher_alg;
  mbedtls_asn1_buf pbe_params;
  mbedtls_asn1_buf pbe_alg_oid;
  uchar *end;
  uchar *p;
  uchar *buf;
  size_t len;
  int decrypted;
  int ret;
  size_t pwdlen_local;
  uchar *pwd_local;
  size_t keylen_local;
  uchar *key_local;
  mbedtls_pk_context *pk_local;
  
  len._0_4_ = 0;
  if (pwdlen == 0) {
    pk_local._4_4_ = -0x3c00;
  }
  else {
    end = key;
    _decrypted = pwdlen;
    pwdlen_local = (size_t)pwd;
    pwd_local = (uchar *)keylen;
    keylen_local = (size_t)key;
    key_local = (uchar *)pk;
    len._4_4_ = mbedtls_asn1_get_tag(&end,key + keylen,(size_t *)&buf,0x30);
    if (len._4_4_ == 0) {
      end_00 = end + (long)buf;
      len._4_4_ = mbedtls_asn1_get_alg
                            (&end,end_00,(mbedtls_asn1_buf *)&pbe_params.p,
                             (mbedtls_asn1_buf *)&md_alg);
      if (len._4_4_ == 0) {
        len._4_4_ = mbedtls_asn1_get_tag(&end,end_00,(size_t *)&buf,4);
        if (len._4_4_ == 0) {
          p = end;
          iVar1 = mbedtls_oid_get_pkcs12_pbe_alg
                            ((mbedtls_asn1_buf *)&pbe_params.p,&local_98,&local_94);
          if (iVar1 == 0) {
            iVar1 = mbedtls_pkcs12_pbe((mbedtls_asn1_buf *)&md_alg,0,local_94,local_98,
                                       (uchar *)pwdlen_local,_decrypted,end,(size_t)buf,p);
            if (iVar1 != 0) {
              if (iVar1 != -0x1e00) {
                return iVar1;
              }
              return -0x3b80;
            }
            len._0_4_ = 1;
            len._4_4_ = 0;
          }
          else {
            bVar2 = true;
            if (pbe_alg_oid._0_8_ == 10) {
              iVar1 = memcmp(anon_var_dwarf_3e11,(void *)pbe_alg_oid.len,10);
              bVar2 = iVar1 != 0;
            }
            if (bVar2) {
              bVar2 = true;
              if (pbe_alg_oid._0_8_ == 9) {
                iVar1 = memcmp(anon_var_dwarf_3e28,(void *)pbe_alg_oid.len,9);
                bVar2 = iVar1 != 0;
              }
              if (!bVar2) {
                iVar1 = mbedtls_pkcs5_pbes2((mbedtls_asn1_buf *)&md_alg,0,(uchar *)pwdlen_local,
                                            _decrypted,end,(size_t)buf,p);
                if (iVar1 != 0) {
                  if (iVar1 != -0x2e00) {
                    return iVar1;
                  }
                  return -0x3b80;
                }
                len._0_4_ = 1;
                len._4_4_ = 0;
              }
            }
            else {
              iVar1 = mbedtls_pkcs12_pbe_sha1_rc4_128
                                ((mbedtls_asn1_buf *)&md_alg,0,(uchar *)pwdlen_local,_decrypted,end,
                                 (size_t)buf,p);
              if (iVar1 != 0) {
                return iVar1;
              }
              if (*p != '0') {
                return -0x3b80;
              }
              len._0_4_ = 1;
              len._4_4_ = 0;
            }
          }
          if ((int)len == 0) {
            pk_local._4_4_ = -0x3980;
          }
          else {
            pk_local._4_4_ =
                 pk_parse_key_pkcs8_unencrypted_der((mbedtls_pk_context *)key_local,p,(size_t)buf);
          }
        }
        else {
          pk_local._4_4_ = len._4_4_ + -0x3d00;
        }
      }
      else {
        pk_local._4_4_ = len._4_4_ + -0x3d00;
      }
    }
    else {
      pk_local._4_4_ = len._4_4_ + -0x3d00;
    }
  }
  return pk_local._4_4_;
}

Assistant:

static int pk_parse_key_pkcs8_encrypted_der(
                                    mbedtls_pk_context *pk,
                                    unsigned char *key, size_t keylen,
                                    const unsigned char *pwd, size_t pwdlen )
{
    int ret, decrypted = 0;
    size_t len;
    unsigned char *buf;
    unsigned char *p, *end;
    mbedtls_asn1_buf pbe_alg_oid, pbe_params;
#if defined(MBEDTLS_PKCS12_C)
    mbedtls_cipher_type_t cipher_alg;
    mbedtls_md_type_t md_alg;
#endif

    p = key;
    end = p + keylen;

    if( pwdlen == 0 )
        return( MBEDTLS_ERR_PK_PASSWORD_REQUIRED );

    /*
     * This function parses the EncryptedPrivateKeyInfo object (PKCS#8)
     *
     *  EncryptedPrivateKeyInfo ::= SEQUENCE {
     *    encryptionAlgorithm  EncryptionAlgorithmIdentifier,
     *    encryptedData        EncryptedData
     *  }
     *
     *  EncryptionAlgorithmIdentifier ::= AlgorithmIdentifier
     *
     *  EncryptedData ::= OCTET STRING
     *
     *  The EncryptedData OCTET STRING is a PKCS#8 PrivateKeyInfo
     *
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    end = p + len;

    if( ( ret = mbedtls_asn1_get_alg( &p, end, &pbe_alg_oid, &pbe_params ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len, MBEDTLS_ASN1_OCTET_STRING ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    buf = p;

    /*
     * Decrypt EncryptedData with appropriate PBE
     */
#if defined(MBEDTLS_PKCS12_C)
    if( mbedtls_oid_get_pkcs12_pbe_alg( &pbe_alg_oid, &md_alg, &cipher_alg ) == 0 )
    {
        if( ( ret = mbedtls_pkcs12_pbe( &pbe_params, MBEDTLS_PKCS12_PBE_DECRYPT,
                                cipher_alg, md_alg,
                                pwd, pwdlen, p, len, buf ) ) != 0 )
        {
            if( ret == MBEDTLS_ERR_PKCS12_PASSWORD_MISMATCH )
                return( MBEDTLS_ERR_PK_PASSWORD_MISMATCH );

            return( ret );
        }

        decrypted = 1;
    }
    else if( MBEDTLS_OID_CMP( MBEDTLS_OID_PKCS12_PBE_SHA1_RC4_128, &pbe_alg_oid ) == 0 )
    {
        if( ( ret = mbedtls_pkcs12_pbe_sha1_rc4_128( &pbe_params,
                                             MBEDTLS_PKCS12_PBE_DECRYPT,
                                             pwd, pwdlen,
                                             p, len, buf ) ) != 0 )
        {
            return( ret );
        }

        // Best guess for password mismatch when using RC4. If first tag is
        // not MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE
        //
        if( *buf != ( MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) )
            return( MBEDTLS_ERR_PK_PASSWORD_MISMATCH );

        decrypted = 1;
    }
    else
#endif /* MBEDTLS_PKCS12_C */
#if defined(MBEDTLS_PKCS5_C)
    if( MBEDTLS_OID_CMP( MBEDTLS_OID_PKCS5_PBES2, &pbe_alg_oid ) == 0 )
    {
        if( ( ret = mbedtls_pkcs5_pbes2( &pbe_params, MBEDTLS_PKCS5_DECRYPT, pwd, pwdlen,
                                  p, len, buf ) ) != 0 )
        {
            if( ret == MBEDTLS_ERR_PKCS5_PASSWORD_MISMATCH )
                return( MBEDTLS_ERR_PK_PASSWORD_MISMATCH );

            return( ret );
        }

        decrypted = 1;
    }
    else
#endif /* MBEDTLS_PKCS5_C */
    {
        ((void) pwd);
    }

    if( decrypted == 0 )
        return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );

    return( pk_parse_key_pkcs8_unencrypted_der( pk, buf, len ) );
}